

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O0

Pass * wasm::createGUFACastAllPass(void)

{
  GUFAPass *this;
  
  this = (GUFAPass *)operator_new(0x60);
  anon_unknown_174::GUFAPass::GUFAPass(this,false,true);
  return &this->super_Pass;
}

Assistant:

Pass* createGUFACastAllPass() { return new GUFAPass(false, true); }